

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_get_defined_func(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  SyHashEntry_Pr *pSVar2;
  int iVar3;
  jx9_value *pSrc;
  uint uVar4;
  SyHashEntry_Pr **ppSVar5;
  
  pSrc = jx9_context_new_array(pCtx);
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pjVar1 = pCtx->pVm;
    if ((pjVar1->hHostFunction).nEntry != 0) {
      ppSVar5 = &(pjVar1->hHostFunction).pList;
      uVar4 = 0;
      do {
        pSVar2 = *ppSVar5;
        iVar3 = VmHashFuncStep((SyHashEntry *)pSVar2,pSrc);
        if (iVar3 != 0) break;
        ppSVar5 = &pSVar2->pNext;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (pjVar1->hHostFunction).nEntry);
    }
    pjVar1 = pCtx->pVm;
    if ((pjVar1->hFunction).nEntry != 0) {
      ppSVar5 = &(pjVar1->hFunction).pList;
      uVar4 = 0;
      do {
        pSVar2 = *ppSVar5;
        iVar3 = VmHashFuncStep((SyHashEntry *)pSVar2,pSrc);
        if (iVar3 != 0) break;
        ppSVar5 = &pSVar2->pNext;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (pjVar1->hFunction).nEntry);
    }
    jx9MemObjStore(pSrc,pCtx->pRet);
  }
  return 0;
}

Assistant:

static int vm_builtin_get_defined_func(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray;
	/* NOTE:
	 * Don't worry about freeing memory here, every allocated resource will be released
	 * automatically by the engine as soon we return from this foreign function.
	 */
	pArray = jx9_context_new_array(pCtx);
 	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hHostFunction,VmHashFuncStep,pArray);
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hFunction, VmHashFuncStep,pArray);
	/* Return a copy of the array array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}